

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStorage::SetFloat(ImGuiStorage *this,ImGuiID key,float val)

{
  ImGuiStoragePair *pIVar1;
  ImGuiStoragePair *pIVar2;
  ImGuiID in_ESI;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_RDI;
  float in_XMM0_Da;
  ImGuiStoragePair *it;
  ImGuiStoragePair *v;
  ImGuiStoragePair *in_stack_ffffffffffffffd8;
  anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 in_stack_ffffffffffffffe0;
  
  pIVar1 = LowerBound(in_RDI,in_ESI);
  v = pIVar1;
  pIVar2 = ImVector<ImGuiStorage::ImGuiStoragePair>::end(in_RDI);
  if ((v == pIVar2) || (pIVar1->key != in_ESI)) {
    ImGuiStoragePair::ImGuiStoragePair
              ((ImGuiStoragePair *)&stack0xffffffffffffffd8,in_ESI,in_XMM0_Da);
    ImVector<ImGuiStorage::ImGuiStoragePair>::insert
              ((ImVector<ImGuiStorage::ImGuiStoragePair> *)in_stack_ffffffffffffffe0.val_p,
               in_stack_ffffffffffffffd8,v);
  }
  else {
    (pIVar1->field_1).val_f = in_XMM0_Da;
  }
  return;
}

Assistant:

void ImGuiStorage::SetFloat(ImGuiID key, float val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, ImGuiStoragePair(key, val));
        return;
    }
    it->val_f = val;
}